

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

void __thiscall ipx::ForrestTomlin::ComputeEta(ForrestTomlin *this,Int j)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  size_t sVar4;
  double *__s;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  piVar3 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = (this->colperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[j];
  uVar8 = (uint)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      iVar5 = this->dim_ + (int)uVar7;
      if (piVar3[uVar7] != iVar6) {
        iVar5 = iVar6;
      }
      iVar6 = iVar5;
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  sVar4 = (this->work_)._M_size;
  __s = (this->work_)._M_data;
  if (sVar4 != 0) {
    memset(__s,0,sVar4 << 3);
  }
  __s[iVar6] = 1.0;
  TriangularSolve(&this->U_,&this->work_,'t',"upper",0);
  SparseMatrix::clear_queue(&this->R_);
  if (iVar6 + 1 < (int)(this->dim_ + uVar8)) {
    dVar1 = (this->work_)._M_data[iVar6];
    lVar9 = (long)(iVar6 + 1);
    do {
      dVar2 = (this->work_)._M_data[lVar9];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        SparseMatrix::push_back(&this->R_,(Int)lVar9,-dVar2 / dVar1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (long)this->dim_ + (long)(int)uVar8);
  }
  this->have_btran_ = true;
  this->replace_next_ = iVar6;
  return;
}

Assistant:

void ForrestTomlin::ComputeEta(Int j) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Find permuted position of j.
    Int pos = colperm_inv_[j];
    for (Int k = 0; k < num_updates; k++)
        if (replaced_[k] == pos)
            pos = dim_+k;

    // Solve lhs'U=e_pos'. Replaced position must remain zero (by the fact that
    // the corresponding columns of U are unit), so replaced indices cannot
    // occur in the new eta matrix.
    work_ = 0.0;
    work_[pos] = 1.0;
    TriangularSolve(U_, work_, 't', "upper", 0);
    #ifndef NDEBUG
    for (Int k = 0; k < num_updates; k++)
        assert(work_[replaced_[k]] == 0.0);
    #endif

    // Queue eta at end of R. Indices are sorted, which is required for the
    // sparse dot product in Update().
    R_.clear_queue();
    double pivot = work_[pos];
    for (Int i = pos+1; i < dim_+num_updates; i++) {
        if (work_[i] != 0.0)
            R_.push_back(i, -work_[i]/pivot);
    }
    have_btran_ = true;
    replace_next_ = pos;
}